

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

unique_ptr<Descriptor,_std::default_delete<Descriptor>_>
wallet::GetDescriptor(CWallet *wallet,CCoinControl *coin_control,CScript *script_pubkey)

{
  long lVar1;
  bool bVar2;
  reference ppSVar3;
  CScript *in_RCX;
  long in_RDX;
  _Self *in_RDI;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spkman;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  MultiSigningProvider providers;
  MultiSigningProvider *in_stack_ffffffffffffff18;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffff20;
  _Head_base<0UL,_Descriptor_*,_false> provider;
  FlatSigningProvider *in_stack_ffffffffffffff40;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> local_78;
  undefined1 local_70 [8];
  _Base_ptr local_68;
  _Base_ptr local_60;
  CScript *in_stack_ffffffffffffffc8;
  CWallet *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  provider._M_head_impl = (Descriptor *)in_RDI;
  MultiSigningProvider::MultiSigningProvider(in_stack_ffffffffffffff18);
  CWallet::GetScriptPubKeyMans(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_60 = (_Base_ptr)
             std::
             set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
             ::begin(in_stack_ffffffffffffff20);
  local_68 = (_Base_ptr)
             std::
             set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
             ::end(in_stack_ffffffffffffff20);
  while( true ) {
    bVar2 = std::operator==(in_RDI,(_Self *)in_stack_ffffffffffffff20);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff40 = (FlatSigningProvider *)*ppSVar3;
    (*(in_stack_ffffffffffffff40->super_SigningProvider)._vptr_SigningProvider[0x15])
              (local_70,in_stack_ffffffffffffff40,in_RCX);
    MultiSigningProvider::AddProvider
              (in_stack_ffffffffffffff18,
               (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)0x16cc9ed);
    _GLOBAL__N_1::std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::
    ~unique_ptr((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)in_RDI);
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffff18);
  }
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          *)in_stack_ffffffffffffff18);
  if (in_RDX != 0) {
    std::make_unique<FlatSigningProvider,FlatSigningProvider_const&>(in_stack_ffffffffffffff40);
    std::unique_ptr<SigningProvider,std::default_delete<SigningProvider>>::
    unique_ptr<FlatSigningProvider,std::default_delete<FlatSigningProvider>,void>
              ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)in_RDI,
               &local_78);
    MultiSigningProvider::AddProvider
              (in_stack_ffffffffffffff18,
               (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)0x16cca93);
    _GLOBAL__N_1::std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::
    ~unique_ptr((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)in_RDI);
    std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
              ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)in_RDI)
    ;
  }
  InferDescriptor(in_RCX,(SigningProvider *)provider._M_head_impl);
  MultiSigningProvider::~MultiSigningProvider(in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<Descriptor,_std::default_delete<Descriptor>,_true,_true>)
           (tuple<Descriptor_*,_std::default_delete<Descriptor>_>)provider._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<Descriptor> GetDescriptor(const CWallet* wallet, const CCoinControl* coin_control,
                                                 const CScript script_pubkey)
{
    MultiSigningProvider providers;
    for (const auto spkman: wallet->GetScriptPubKeyMans(script_pubkey)) {
        providers.AddProvider(spkman->GetSolvingProvider(script_pubkey));
    }
    if (coin_control) {
        providers.AddProvider(std::make_unique<FlatSigningProvider>(coin_control->m_external_provider));
    }
    return InferDescriptor(script_pubkey, providers);
}